

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Vocoder.cpp
# Opt level: O3

int Vocoder::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pfVar2 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar2 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = Vocoder::EffectData]")
    ;
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    fVar9 = powf(10.0,*pfVar2 * 0.05 + 2.5);
    fVar10 = (float)(state->field_0).field_0.samplerate;
    fVar14 = fVar10 * 0.25;
    fVar10 = 1.0 / fVar10;
    fVar11 = powf(0.001,fVar10 / pfVar2[5]);
    fVar1 = pfVar2[6];
    pfVar4 = pfVar2 + 0x14;
    lVar8 = 0;
    do {
      fVar12 = ((float)(&freqs)[lVar8] * pfVar2[2] + pfVar2[1]) * 0.25;
      fVar15 = 10.0;
      if ((10.0 <= fVar12) && (fVar15 = fVar12, fVar14 < fVar12)) {
        fVar15 = fVar14;
      }
      fVar15 = fVar15 * fVar10 * 1.5707964;
      fVar12 = pfVar2[3];
      fVar13 = sinf(fVar15);
      fVar17 = pfVar2[4];
      fVar15 = sinf(fVar15);
      if (0 < inchannels) {
        lVar3 = 0;
        do {
          *(float *)((long)pfVar4 + lVar3 + -0x34) = fVar13 + fVar13;
          *(float *)((long)pfVar4 + lVar3 + -0x24) = fVar13 + fVar13;
          *(float *)((long)pfVar4 + lVar3 + -0x30) = fVar12;
          *(float *)((long)pfVar4 + lVar3 + -0x20) = fVar12;
          *(float *)((long)pfVar4 + lVar3 + -0x14) = fVar15 + fVar15;
          *(float *)((long)pfVar4 + lVar3 + -4) = fVar15 + fVar15;
          *(float *)((long)pfVar4 + lVar3 + -0x10) = fVar17;
          *(float *)((long)pfVar4 + lVar3) = fVar17;
          lVar3 = lVar3 + 0x2ec;
        } while ((ulong)(uint)inchannels * 0x2ec - lVar3 != 0);
      }
      fVar9 = fVar9 * fVar1;
      lVar8 = lVar8 + 1;
      pfVar4 = pfVar4 + 0x11;
    } while (lVar8 != 0xb);
    if (length != 0) {
      pfVar4 = (state->field_0).field_0.sidechainbuffer;
      uVar5 = 0;
      do {
        if (0 < inchannels) {
          uVar7 = 0;
          pfVar6 = pfVar2;
          do {
            fVar10 = *inbuffer * fVar9 + 1e-11 + 1e-11;
            fVar1 = *pfVar4;
            fVar14 = 0.0;
            lVar8 = 0x5c;
            do {
              fVar15 = *(float *)((long)pfVar6 + lVar8 + -0x20);
              fVar12 = *(float *)((long)pfVar6 + lVar8 + -0x14);
              fVar13 = fVar15 * fVar12 + *(float *)((long)pfVar6 + lVar8 + -0x18);
              fVar17 = *(float *)((long)pfVar6 + lVar8 + -0x1c);
              fVar12 = ((fVar10 - fVar12) * fVar17 - fVar13) * fVar15 + fVar12;
              fVar13 = fVar15 * fVar12 + fVar13;
              *(float *)((long)pfVar6 + lVar8 + -0x18) = fVar13;
              fVar12 = ((fVar10 - fVar12) * fVar17 - fVar13) * fVar15 + fVar12;
              *(float *)((long)pfVar6 + lVar8 + -0x14) = fVar12;
              fVar12 = fVar12 + 1e-11;
              fVar15 = *(float *)((long)pfVar6 + lVar8 + -0x10);
              fVar17 = *(float *)((long)pfVar6 + lVar8 + -4);
              fVar16 = fVar15 * fVar17 + *(float *)((long)pfVar6 + lVar8 + -8);
              fVar13 = *(float *)((long)pfVar6 + lVar8 + -0xc);
              fVar17 = ((fVar12 - fVar17) * fVar13 - fVar16) * fVar15 + fVar17;
              fVar16 = fVar15 * fVar17 + fVar16;
              *(float *)((long)pfVar6 + lVar8 + -8) = fVar16;
              fVar17 = ((fVar12 - fVar17) * fVar13 - fVar16) * fVar15 + fVar17;
              *(float *)((long)pfVar6 + lVar8 + -4) = fVar17;
              fVar15 = *(float *)((long)pfVar6 + lVar8 + -0x34);
              fVar12 = *(float *)((long)pfVar6 + lVar8 + -0x40);
              fVar13 = *(float *)((long)pfVar6 + lVar8 + -0x3c);
              fVar16 = fVar12 * fVar15 + *(float *)((long)pfVar6 + lVar8 + -0x38);
              fVar15 = (((fVar1 + 1e-11) - fVar15) * fVar13 - fVar16) * fVar12 + fVar15;
              fVar16 = fVar12 * fVar15 + fVar16;
              *(float *)((long)pfVar6 + lVar8 + -0x38) = fVar16;
              fVar15 = (((fVar1 + 1e-11) - fVar15) * fVar13 - fVar16) * fVar12 + fVar15;
              *(float *)((long)pfVar6 + lVar8 + -0x34) = fVar15;
              fVar15 = fVar15 + 1e-11;
              fVar12 = *(float *)((long)pfVar6 + lVar8 + -0x24);
              fVar13 = *(float *)((long)pfVar6 + lVar8 + -0x30);
              fVar18 = fVar13 * fVar12 + *(float *)((long)pfVar6 + lVar8 + -0x28);
              fVar16 = *(float *)((long)pfVar6 + lVar8 + -0x2c);
              fVar12 = ((fVar15 - fVar12) * fVar16 - fVar18) * fVar13 + fVar12;
              fVar18 = fVar13 * fVar12 + fVar18;
              *(float *)((long)pfVar6 + lVar8 + -0x28) = fVar18;
              fVar12 = ((fVar15 - fVar12) * fVar16 - fVar18) * fVar13 + fVar12;
              *(float *)((long)pfVar6 + lVar8 + -0x24) = fVar12;
              fVar15 = (ABS(fVar12) - *(float *)((long)pfVar6 + lVar8)) * (1.0 - fVar11) + 1e-11 +
                       *(float *)((long)pfVar6 + lVar8);
              *(float *)((long)pfVar6 + lVar8) = fVar15;
              fVar14 = fVar14 + fVar15 * fVar17;
              lVar8 = lVar8 + 0x44;
            } while (lVar8 != 0x348);
            inbuffer = inbuffer + 1;
            pfVar4 = pfVar4 + 1;
            *outbuffer = fVar14;
            outbuffer = outbuffer + 1;
            uVar7 = uVar7 + 1;
            pfVar6 = pfVar6 + 0xbb;
          } while (uVar7 != (uint)inchannels);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != length);
    }
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Vocoder::EffectData]");
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        float gain = powf(10.0f, 0.05f * data->p[P_GAIN] + 2.5);
        float maxfreq = 0.25f * state->samplerate;
        float sampletime = 1.0f / (float)state->samplerate;
        float w0 = 0.5f * kPI * sampletime;
        float envdecay = 1.0f - powf(0.001f, sampletime / data->p[P_ENVDECAY]);
        float emph = data->p[P_EMPHASIS];
        for (int j = 0; j < NUMBANDS; j++)
        {
            float f = 0.25f * (freqs[j] * data->p[P_FMTSCALE] + data->p[P_FMTSHIFT]);
            if (f < 10.0f)
                f = 10.0f;
            else if (f > maxfreq)
                f = maxfreq;
            float w = f * w0;
            float ra = data->p[P_ANALYSISBW];
            float ca = 2.0f * sinf(w);
            float rs = data->p[P_SYNTHESISBW];
            float cs = 2.0f * sinf(w);
            for (int i = 0; i < inchannels; i++)
            {
                data->bands[i][j].analysis1.cutoff = ca;
                data->bands[i][j].analysis2.cutoff = ca;
                data->bands[i][j].analysis1.bandwidth = ra;
                data->bands[i][j].analysis2.bandwidth = ra;
                data->bands[i][j].synthesis1.cutoff = cs;
                data->bands[i][j].synthesis2.cutoff = cs;
                data->bands[i][j].synthesis1.bandwidth = rs;
                data->bands[i][j].synthesis2.bandwidth = rs;
            }
            gain *= emph;
        }

        float* sidechainBuffer = state->sidechainbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < inchannels; i++)
            {
                float input = (*inbuffer++) * gain + 1.0e-11f;
                float sidechainInput = *sidechainBuffer++;
                float sum = 0.0f;
                Band* b = data->bands[i];
                Band* b_end = b + NUMBANDS;
                while (b != b_end)
                {
                    float carrier = b->synthesis2.ProcessBPF(b->synthesis1.ProcessBPF(input));
                    float source = b->analysis2.ProcessBPF(b->analysis1.ProcessBPF(sidechainInput));
                    float env = b->envfollow.Process(source, envdecay);
                    sum += carrier * env;
                    ++b;
                }
                *outbuffer++ = sum;
            }
        }

        return UNITY_AUDIODSP_OK;
    }